

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<int>::AddAlreadyReserved(RepeatedField<int> *this,int *value)

{
  int iVar1;
  int iVar2;
  
  iVar1 = *value;
  iVar2 = this->current_size_;
  this->current_size_ = iVar2 + 1;
  *(int *)((long)this->arena_or_elements_ + (long)iVar2 * 4) = iVar1;
  return;
}

Assistant:

inline void RepeatedField<Element>::AddAlreadyReserved(const Element& value) {
  GOOGLE_DCHECK_LT(current_size_, total_size_);
  elements()[current_size_++] = value;
}